

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

executor * __thiscall
spdlog::logger::log_<int&>
          (executor *__return_storage_ptr__,logger *this,source_loc loc,level_enum lvl,
          string_view_t fmt,int *args)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  log_msg log_msg;
  memory_buf_t buf;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if ((int)lvl < iVar1 && !traceback_enabled) {
    details::executor::executor(__return_storage_ptr__);
  }
  else {
    buf.super_buffer<char>.ptr_ = buf.store_;
    buf.super_buffer<char>.size_ = 0;
    buf.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c480;
    buf.super_buffer<char>.capacity_ = 0xfa;
    log_msg.logger_name.data_ = (char *)(ulong)(uint)*args;
    args_00.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&log_msg;
    args_00.desc_ = 1;
    ::fmt::v8::detail::vformat_to<char>(&buf.super_buffer<char>,fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = buf.super_buffer<char>.size_;
    msg.data_ = buf.super_buffer<char>.ptr_;
    details::log_msg::log_msg(&log_msg,loc,a_logger_name,lvl,msg);
    log_it_(__return_storage_ptr__,this,&log_msg,iVar1 <= (int)lvl,traceback_enabled);
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(&buf);
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_EXECUTOR_T log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return SPDLOG_EXECUTOR_T{};
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(args...));
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            return log_it_(log_msg, log_enabled, traceback_enabled);
        }